

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::finalizeTable(TranslateToFuzzReader *this)

{
  long lVar1;
  pointer ppGVar2;
  bool bVar3;
  long lVar4;
  Const *pCVar5;
  long lVar6;
  long *plVar7;
  undefined8 uVar8;
  ulong uVar9;
  long *plVar10;
  long *plVar11;
  pointer ppGVar12;
  Name NVar13;
  Literal local_98;
  _Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_> local_80;
  Builder *local_68;
  long *local_60;
  long local_58;
  long *local_50;
  Random *local_48;
  long *local_40;
  TranslateToFuzzReader *local_38;
  
  plVar11 = *(long **)(this->wasm + 0xa8);
  local_50 = *(long **)(this->wasm + 0xb0);
  local_68 = &this->builder;
  local_48 = &this->random;
  local_38 = this;
  while( true ) {
    if (plVar11 == local_50) {
      return;
    }
    lVar6 = *plVar11;
    lVar4 = *(long *)(lVar6 + 8);
    if (lVar4 == 0) break;
    plVar10 = *(long **)(local_38->wasm + 0x68);
    local_58 = lVar4;
    local_40 = plVar10;
    for (plVar7 = *(long **)(local_38->wasm + 0x60); plVar7 != plVar10; plVar7 = plVar7 + 1) {
      lVar1 = *plVar7;
      if (*(long *)(lVar1 + 0x20) == lVar4) {
        if (((byte)local_38->wasm[0x179] & 4) == 0) {
          local_60 = plVar7;
          FindAll<wasm::GlobalGet>::FindAll
                    ((FindAll<wasm::GlobalGet> *)&local_80,*(Expression **)(lVar1 + 0x28));
          ppGVar2 = local_80._M_impl.super__Vector_impl_data._M_finish;
          for (ppGVar12 = local_80._M_impl.super__Vector_impl_data._M_start; ppGVar12 != ppGVar2;
              ppGVar12 = ppGVar12 + 1) {
            NVar13.super_IString.str._M_str = (char *)((*ppGVar12)->name).super_IString.str._M_len;
            NVar13.super_IString.str._M_len = (size_t)local_38->wasm;
            lVar4 = wasm::Module::getGlobal(NVar13);
            if (*(long *)(lVar4 + 0x20) != 0) {
              __assert_fail("!wasm.getGlobal(get->name)->imported()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                            ,0x32b,
                            "auto wasm::TranslateToFuzzReader::finalizeTable()::(anonymous class)::operator()(ElementSegment *) const"
                           );
            }
            Literal::makeFromInt32(&local_98,0,(Type)*(uintptr_t *)(*plVar11 + 0x48));
            pCVar5 = Builder::makeConst(local_68,&local_98);
            *(Const **)(lVar1 + 0x28) = pCVar5;
            wasm::Literal::~Literal(&local_98);
          }
          std::_Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>::~_Vector_base
                    (&local_80);
          plVar7 = local_60;
          plVar10 = local_40;
          lVar4 = local_58;
        }
        uVar9 = *(long *)(lVar1 + 0x40) - *(long *)(lVar1 + 0x38) >> 3;
        if (**(char **)(lVar1 + 0x28) == '\x0e') {
          lVar6 = wasm::Literal::getInteger();
          uVar9 = uVar9 + lVar6;
          plVar10 = local_40;
        }
        lVar6 = *plVar11;
        if (uVar9 < *(ulong *)(lVar6 + 0x38)) {
          uVar9 = *(ulong *)(lVar6 + 0x38);
        }
        *(ulong *)(lVar6 + 0x38) = uVar9;
      }
    }
    uVar9 = *(ulong *)(lVar6 + 0x38);
    if (9999 < uVar9) {
      uVar9 = 10000;
    }
    *(ulong *)(lVar6 + 0x38) = uVar9;
    bVar3 = Random::oneIn(local_48,2);
    lVar4 = *plVar11;
    uVar8 = 0xffffffff;
    if (!bVar3) {
      uVar8 = *(undefined8 *)(lVar4 + 0x38);
    }
    *(undefined8 *)(lVar4 + 0x40) = uVar8;
    if (local_38->preserveImportsAndExports == false) {
      *(undefined8 *)(lVar4 + 0x28) = 0;
      *(undefined8 *)(lVar4 + 0x30) = 0;
      lVar4 = *plVar11;
      *(undefined8 *)(lVar4 + 0x18) = 0;
      *(undefined8 *)(lVar4 + 0x20) = 0;
    }
    plVar11 = plVar11 + 1;
  }
  __assert_fail("table.is() && \"Table name must not be null\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x85,
                "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp:803:26)]"
               );
}

Assistant:

void TranslateToFuzzReader::finalizeTable() {
  for (auto& table : wasm.tables) {
    ModuleUtils::iterTableSegments(
      wasm, table->name, [&](ElementSegment* segment) {
        // If the offset contains a global that was imported (which is ok) but
        // no longer is (not ok unless GC is enabled), we may need to change
        // that.
        if (!wasm.features.hasGC()) {
          for ([[maybe_unused]] auto* get :
               FindAll<GlobalGet>(segment->offset).list) {
            // No imported globals should remain.
            assert(!wasm.getGlobal(get->name)->imported());
            // TODO: the segments must not overlap...
            segment->offset =
              builder.makeConst(Literal::makeFromInt32(0, table->addressType));
          }
        }
        Address maxOffset = segment->data.size();
        if (auto* offset = segment->offset->dynCast<Const>()) {
          maxOffset = maxOffset + offset->value.getInteger();
        }
        table->initial = std::max(table->initial, maxOffset);
      });

    // The code above raises table->initial to a size large enough to accomodate
    // all of its segments, with the intention of avoiding a trap during
    // startup. However a single segment of (say) size 4GB would have a table of
    // that size, which will use a lot of memory and execute very slowly, so we
    // prefer in the fuzzer to trap on such a thing. To achieve that, set a
    // reasonable limit for the maximum table size.
    //
    // This also avoids an issue that arises from table->initial being an
    // Address (64 bits) but Table::kMaxSize being an Index (32 bits), as a
    // result of which we need to clamp to Table::kMaxSize as well in order for
    // the module to validate (but since we are clamping to a smaller value,
    // there is no need).
    const Address ReasonableMaxTableSize = 10000;
    table->initial = std::min(table->initial, ReasonableMaxTableSize);
    assert(ReasonableMaxTableSize <= Table::kMaxSize);

    table->max = oneIn(2) ? Address(Table::kUnlimitedSize) : table->initial;

    if (!preserveImportsAndExports) {
      // Avoid an imported table (which the fuzz harness would need to handle).
      table->module = table->base = Name();
    }
  }
}